

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  sqlite3_io_methods *psVar2;
  PCache *pCache;
  sqlite3_file *psVar3;
  long lVar4;
  u8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Btree *p;
  BtShared *__s;
  size_t sVar10;
  size_t sVar11;
  Pager *pPVar12;
  char *pcVar13;
  ulong uVar14;
  sqlite3_mutex *psVar15;
  sqlite3_mutex *psVar16;
  void *pvVar17;
  byte bVar18;
  Btree **ppBVar19;
  code *pcVar20;
  Btree *pBVar21;
  uint uVar22;
  long lVar23;
  Btree *pBVar24;
  int iVar25;
  uint uVar26;
  Btree *pBVar27;
  Btree *pBVar28;
  ulong __n;
  u64 n;
  char *pcVar29;
  byte bVar30;
  bool bVar31;
  bool bVar32;
  uchar zDbHeader [100];
  sqlite3_mutex *local_110;
  char *local_108;
  u8 local_100;
  uint local_ec;
  char *local_d8;
  u8 local_c8;
  char *local_c0;
  uint local_9c;
  uint local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
LAB_00147af2:
    bVar31 = true;
    if (db->temp_store != '\x02') goto LAB_00147b0d;
LAB_00147b00:
    local_ec = flags | 2;
    bVar18 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar31 = cVar1 == '\0';
    iVar6 = strcmp(zFilename,":memory:");
    if (iVar6 == 0) goto LAB_00147b00;
    if (cVar1 == '\0') goto LAB_00147af2;
    bVar31 = false;
LAB_00147b0d:
    bVar18 = (byte)((vfsFlags & 0x80U) >> 7);
    local_ec = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar8 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar18 == 0 && !bVar31) {
    uVar8 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar8 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  uVar7 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->nBackup = 0;
  p->iBDataVersion = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar31) && ((uVar8 >> 0x11 & 1) != 0 && ((uVar8 & 0x40) == 0 & bVar18) == 0)) {
    if (zFilename == (char *)0x0) {
      uVar22 = 1;
    }
    else {
      sVar10 = strlen(zFilename);
      uVar22 = ((uint)sVar10 & 0x3fffffff) + 1;
    }
    uVar26 = pVfs->mxPathname + 1;
    uVar9 = uVar22;
    if ((int)uVar22 < (int)uVar26) {
      uVar9 = uVar26;
    }
    pcVar29 = (char *)sqlite3Malloc((ulong)uVar9);
    p->sharable = '\x01';
    if (pcVar29 == (char *)0x0) {
LAB_00148191:
      sqlite3_free(p);
      return uVar7;
    }
    if (bVar18 == 0) {
      *pcVar29 = '\0';
      uVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar26,pcVar29);
      if ((uVar7 & 0xfffffdff) != 0) {
        sqlite3_free(pcVar29);
        goto LAB_00148191;
      }
    }
    else {
      memcpy(pcVar29,zFilename,(ulong)uVar22);
    }
    bVar31 = true;
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar15 = (sqlite3_mutex *)0x0;
      bVar32 = true;
      local_110 = (sqlite3_mutex *)0x0;
    }
    else {
      local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar32 = local_110 == (sqlite3_mutex *)0x0;
      if (!bVar32) {
        (*sqlite3Config.mutex.xMutexEnter)(local_110);
      }
      if ((sqlite3Config.bCoreMutex == '\0') ||
         (psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar15 == (sqlite3_mutex *)0x0)) {
        psVar15 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar15);
        bVar31 = false;
      }
    }
    __s = sqlite3SharedCacheList;
    if (sqlite3SharedCacheList != (BtShared *)0x0) {
LAB_00148140:
      pPVar12 = __s->pPager;
      iVar6 = strcmp(pcVar29,pPVar12->zFilename);
      if ((iVar6 != 0) || (pPVar12->pVfs != pVfs)) goto LAB_00148165;
      lVar23 = (long)db->nDb;
      if (0 < lVar23) {
        uVar14 = lVar23 + 1;
        ppBVar19 = &db->aDb[lVar23 + -1].pBt;
        do {
          if ((*ppBVar19 != (Btree *)0x0) && ((*ppBVar19)->pBt == __s)) {
            if (!bVar31) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar15);
            }
            if (!bVar32) {
              (*sqlite3Config.mutex.xMutexLeave)(local_110);
            }
            sqlite3_free(pcVar29);
            sqlite3_free(p);
            return 0x13;
          }
          uVar14 = uVar14 - 1;
          ppBVar19 = ppBVar19 + -4;
        } while (1 < uVar14);
      }
      p->pBt = __s;
      __s->nRef = __s->nRef + 1;
      goto LAB_0014824b;
    }
    __s = (BtShared *)0x0;
    goto LAB_0014824b;
  }
  local_110 = (sqlite3_mutex *)0x0;
LAB_00147bb8:
  __s = (BtShared *)sqlite3Malloc(0x98);
  if (__s == (BtShared *)0x0) {
    uVar8 = 7;
  }
  else {
    memset(__s,0,0x98);
    local_98[0] = 0x1000;
    iVar6 = 0x50;
    if (0x50 < pVfs->szOsFile) {
      iVar6 = pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    uVar7 = local_ec & 2;
    iVar25 = 1;
    local_c0 = zFilename;
    if (uVar7 == 0) {
      if (zFilename == (char *)0x0) {
        bVar31 = true;
        local_c0 = (char *)0x0;
        local_c8 = '\0';
        local_108 = (char *)0x0;
        local_d8 = (char *)0x0;
        uVar22 = 0;
        goto LAB_00147f1e;
      }
      if (*zFilename == '\0') {
        bVar31 = false;
        local_c8 = '\0';
        goto LAB_00147f0a;
      }
      iVar25 = pVfs->mxPathname;
      local_108 = (char *)sqlite3Malloc((long)iVar25 * 2 + 2);
      if (local_108 == (char *)0x0) goto LAB_001487b8;
      *local_108 = '\0';
      uVar9 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar25 + 1,local_108);
      uVar22 = (int)(uVar8 << 7) >> 0x1f & 0x60e;
      if (uVar9 != 0x200) {
        uVar22 = uVar9;
      }
      sVar10 = strlen(local_108);
      sVar11 = strlen(zFilename);
      uVar9 = (uint)sVar11 & 0x3fffffff;
      local_d8 = zFilename + (ulong)uVar9 + 1;
      pcVar29 = local_d8;
      if (*local_d8 == '\0') {
        iVar25 = uVar9 + (int)zFilename;
      }
      else {
        do {
          sVar11 = strlen(pcVar29);
          pcVar13 = pcVar29 + sVar11;
          sVar11 = strlen(pcVar29 + sVar11 + 1);
          pcVar29 = pcVar13 + sVar11 + 2;
        } while (pcVar13[sVar11 + 2] != '\0');
        iVar25 = (int)sVar11 + (int)pcVar13 + 1;
      }
      if (uVar22 == 0) {
        uVar22 = (uint)sVar10 & 0x3fffffff;
        if ((int)(uVar22 + 8) <= pVfs->mxPathname) {
          iVar25 = (iVar25 - (int)local_d8) + 2;
          bVar31 = false;
          local_c8 = '\0';
          goto LAB_00147f1e;
        }
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xe9ec,
                    "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
        uVar22 = 0xe;
      }
LAB_001481f0:
      uVar8 = uVar22;
      sqlite3_free(local_108);
    }
    else if (zFilename == (char *)0x0) {
      local_c8 = '\x01';
      local_c0 = (char *)0x0;
      bVar31 = true;
LAB_00147f0a:
      local_108 = (char *)0x0;
      uVar22 = 0;
      local_d8 = (char *)0x0;
LAB_00147f1e:
      uVar14 = (ulong)(iVar6 + 7U & 0x7ffffff8);
      __n = (ulong)uVar22;
      sVar10 = (size_t)iVar25;
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + __n * 3 + uVar14 * 2 + sVar10 + 0x19e;
      pPVar12 = (Pager *)sqlite3Malloc(n);
      if (pPVar12 == (Pager *)0x0) {
        uVar8 = 7;
        uVar22 = 7;
        if (local_108 != (char *)0x0) goto LAB_001481f0;
        goto LAB_001487be;
      }
      memset(pPVar12,0,n);
      pPVar12->pPCache = (PCache *)(pPVar12 + 1);
      pPVar12->fd = (sqlite3_file *)&pPVar12[1].fd;
      lVar23 = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40;
      pcVar13 = pPVar12[1].dbFileVers + lVar23;
      pPVar12->sjfd = (sqlite3_file *)pcVar13;
      pcVar13 = pcVar13 + uVar14;
      pPVar12->jfd = (sqlite3_file *)pcVar13;
      pcVar29 = pcVar13 + uVar14 + 0xc;
      *(Pager **)(pcVar13 + uVar14) = pPVar12;
      pPVar12->zFilename = pcVar29;
      if (__n == 0) {
        pPVar12->zJournal = (char *)0x0;
        pPVar12->zWal = (char *)0x0;
      }
      else {
        memcpy(pcVar29,local_108,__n);
        if (local_d8 == (char *)0x0) {
          lVar4 = __n + 2;
        }
        else {
          memcpy(pcVar29 + __n + 1,local_d8,sVar10);
          lVar4 = sVar10 + __n + 1;
        }
        pcVar29 = pcVar29 + lVar4;
        pPVar12->zJournal = pcVar29;
        memcpy(pcVar29,local_108,__n);
        pcVar29 = pcVar29 + __n;
        *(undefined8 *)pcVar29 = 0x6c616e72756f6a2d;
        pPVar12->zWal = pcVar29 + 9;
        memcpy(pcVar29 + 9,local_108,__n);
        builtin_strncpy(pPVar12[1].dbFileVers + __n * 2 + lVar4 + uVar14 + uVar14 + lVar23 + 0x15,
                        "-wal",4);
        if (local_108 != (char *)0x0) {
          sqlite3_free(local_108);
        }
      }
      pPVar12->pVfs = pVfs;
      pPVar12->vfsFlags = uVar8;
      uVar22 = 0;
      if ((bVar31) || (uVar22 = 0, *local_c0 == '\0')) {
LAB_001483fb:
        pPVar12->eState = '\x01';
        pPVar12->eLock = '\x04';
        pPVar12->noLock = '\x01';
        bVar30 = (byte)uVar8 & 1;
        local_100 = '\x01';
        bVar31 = false;
LAB_00148412:
        uVar8 = sqlite3PagerSetPagesize(pPVar12,local_98,-1);
        if (uVar8 == 0) {
          pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (uVar7 == 0) {
            pcVar20 = pagerStress;
          }
          pCache = pPVar12->pPCache;
          pCache->szSpill = 0;
          pCache->szPage = 0;
          pCache->szExtra = 0;
          pCache->bPurgeable = '\0';
          pCache->eCreate = '\0';
          *(undefined2 *)&pCache->field_0x2e = 0;
          pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pCache->pStress = (void *)0x0;
          pCache->pSynced = (PgHdr *)0x0;
          pCache->nRefSum = 0;
          pCache->szCache = 0;
          pCache->pDirty = (PgHdr *)0x0;
          pCache->pDirtyTail = (PgHdr *)0x0;
          pCache->pCache = (sqlite3_pcache *)0x0;
          pCache->szExtra = 0x88;
          pCache->bPurgeable = (byte)(uVar7 >> 1) ^ 1;
          pCache->eCreate = '\x02';
          pCache->xStress = pcVar20;
          pCache->pStress = pPVar12;
          pCache->szCache = 100;
          pCache->szSpill = 1;
          pCache->szPage = 1;
          uVar8 = sqlite3PcacheSetPageSize(pCache,local_98[0]);
          if (uVar8 == 0) {
            pPVar12->useJournal = (byte)(local_ec & 1) ^ 1;
            pPVar12->mxPgno = 0x3fffffff;
            pPVar12->tempFile = local_100;
            pPVar12->exclusiveMode = local_100;
            pPVar12->changeCountDone = local_100;
            pPVar12->memDb = local_c8;
            pPVar12->readOnly = bVar30;
            pPVar12->noSync = local_100;
            if (bVar31) {
              pPVar12->fullSync = '\x01';
              pPVar12->extraSync = '\0';
              pPVar12->syncFlags = '\x02';
              pPVar12->walSyncFlags = '\n';
            }
            pPVar12->nExtra = 0x88;
            pPVar12->journalSizeLimit = -1;
            setSectorSize(pPVar12);
            uVar5 = '\x02';
            if (((local_ec & 1) != 0) || (uVar5 = '\x04', uVar7 != 0 || uVar22 != 0)) {
              pPVar12->journalMode = uVar5;
            }
            pPVar12->xReiniter = pageReinit;
            if (pPVar12->errCode == 0) {
              if (pPVar12->bUseFetch == '\0') {
                pcVar20 = getPageNormal;
              }
              else {
                pcVar20 = getPageMMap;
              }
            }
            else {
              pcVar20 = getPageError;
            }
            pPVar12->xGet = pcVar20;
            __s->pPager = pPVar12;
            pPVar12->szMmap = db->szMmap;
            pagerFixMaplimit(pPVar12);
            local_48 = 0;
            uStack_40 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = 0;
            uStack_80 = 0;
            local_98[0] = 0;
            local_98[1] = 0;
            local_98[2] = 0;
            local_98[3] = 0;
            local_38 = 0;
            psVar3 = __s->pPager->fd;
            psVar2 = psVar3->pMethods;
            if (((psVar2 == (sqlite3_io_methods *)0x0) ||
                (uVar8 = (*psVar2->xRead)(psVar3,local_98,100,0), uVar8 == 0x20a)) || (uVar8 == 0))
            {
              __s->openFlags = (u8)local_ec;
              __s->db = db;
              pPVar12 = __s->pPager;
              pPVar12->xBusyHandler = btreeInvokeBusyHandler;
              pPVar12->pBusyHandlerArg = __s;
              psVar2 = pPVar12->fd->pMethods;
              if (psVar2 != (sqlite3_io_methods *)0x0) {
                (*psVar2->xFileControl)(pPVar12->fd,0xf,&pPVar12->xBusyHandler);
                pPVar12 = __s->pPager;
              }
              p->pBt = __s;
              __s->pCursor = (BtCursor *)0x0;
              __s->pPage1 = (MemPage *)0x0;
              if (pPVar12->readOnly != '\0') {
                *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
              }
              iVar6 = (int)((local_88 & 0xff) << 8);
              uVar8 = (uint)local_88._1_1_ * 0x10000 + iVar6;
              __s->pageSize = uVar8;
              if (((iVar6 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
                 ((uVar8 + 0x1ffff & uVar8) != 0)) {
                __s->pageSize = 0;
                uVar7 = 0;
                if (zFilename != (char *)0x0 && bVar18 == 0) {
                  __s->autoVacuum = '\0';
                  __s->incrVacuum = '\0';
                  uVar7 = 0;
                }
              }
              else {
                uVar7 = (uint)local_88._4_1_;
                __s->btsFlags = __s->btsFlags | 2;
                __s->autoVacuum =
                     ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
                     (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
                __s->incrVacuum =
                     (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) ||
                     (local_58 & 0xff00) != 0) || (local_58 & 0xff) != 0;
              }
              uVar8 = sqlite3PagerSetPagesize(pPVar12,&__s->pageSize,uVar7);
              if (uVar8 == 0) {
                __s->usableSize = __s->pageSize - uVar7;
                __s->nRef = 1;
                if (p->sharable != '\0') {
                  if (sqlite3Config.bCoreMutex != '\0') {
                    psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != '\0') {
                      psVar16 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      __s->mutex = psVar16;
                      if (psVar16 == (sqlite3_mutex *)0x0) goto LAB_001487b8;
                    }
                    if (psVar15 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar15);
                      __s->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = __s;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar15);
                      goto LAB_0014826f;
                    }
                  }
                  __s->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = __s;
                }
LAB_0014826f:
                if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
                  lVar23 = 0;
                  do {
                    pBVar28 = *(Btree **)((long)&db->aDb->pBt + lVar23);
                    if ((pBVar28 != (Btree *)0x0) && (pBVar28->sharable != '\0')) goto LAB_001482b9;
                    lVar23 = lVar23 + 0x20;
                  } while ((long)db->nDb * 0x20 != lVar23);
                }
                goto LAB_00148826;
              }
            }
            goto LAB_001487be;
          }
        }
      }
      else {
        local_9c = 0;
        uVar8 = (*pVfs->xOpen)(pVfs,pPVar12->zFilename,pPVar12->fd,uVar8 & 0x1087f7f,
                               (int *)&local_9c);
        uVar22 = local_9c >> 7 & 1;
        pPVar12->memVfs = (u8)uVar22;
        if (uVar8 == 0) {
          uVar8 = local_9c & 1;
          bVar30 = (byte)uVar8;
          psVar2 = pPVar12->fd->pMethods;
          if (psVar2 == (sqlite3_io_methods *)0x0) {
            bVar31 = true;
          }
          else {
            uVar9 = (*psVar2->xDeviceCharacteristics)(pPVar12->fd);
            bVar31 = (uVar9 >> 0xd & 1) == 0;
          }
          if (uVar8 == 0) {
            setSectorSize(pPVar12);
            uVar8 = pPVar12->sectorSize;
            if (local_98[0] < uVar8) {
              if (uVar8 < 0x2001) {
                local_98[0] = uVar8;
              }
              else {
                local_98[0] = 0x2000;
              }
            }
          }
          iVar6 = sqlite3_uri_boolean(pPVar12->zFilename,"nolock",0);
          pPVar12->noLock = (u8)iVar6;
          if ((!bVar31) ||
             (iVar6 = sqlite3_uri_boolean(pPVar12->zFilename,"immutable",0), iVar6 != 0)) {
            uVar8 = 1;
            goto LAB_001483fb;
          }
          bVar31 = true;
          local_100 = '\0';
          goto LAB_00148412;
        }
      }
      psVar3 = pPVar12->fd;
      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar3->pMethods->xClose)(psVar3);
        psVar3->pMethods = (sqlite3_io_methods *)0x0;
      }
      pcache1Free(pPVar12->pTmpSpace);
      sqlite3_free(pPVar12);
    }
    else {
      if (*zFilename == '\0') {
        local_c8 = '\x01';
        bVar31 = false;
        goto LAB_00147f0a;
      }
      local_108 = sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
      if (local_108 != (char *)0x0) {
        sVar10 = strlen(local_108);
        uVar22 = (uint)sVar10 & 0x3fffffff;
        bVar31 = true;
        local_c0 = (char *)0x0;
        local_c8 = '\x01';
        local_d8 = (char *)0x0;
        goto LAB_00147f1e;
      }
LAB_001487b8:
      uVar8 = 7;
    }
LAB_001487be:
    if (__s->pPager != (Pager *)0x0) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(__s);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_001487ef:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return uVar8;
LAB_00148165:
  __s = __s->pNext;
  if (__s == (BtShared *)0x0) goto code_r0x0014816e;
  goto LAB_00148140;
code_r0x0014816e:
  __s = (BtShared *)0x0;
LAB_0014824b:
  if (!bVar31) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar15);
  }
  sqlite3_free(pcVar29);
  if (__s == (BtShared *)0x0) goto LAB_00147bb8;
  goto LAB_0014826f;
LAB_001482b9:
  do {
    pBVar24 = pBVar28;
    pBVar28 = pBVar24->pPrev;
  } while (pBVar24->pPrev != (Btree *)0x0);
  lVar23 = 0x20;
  if (p->pBt < pBVar24->pBt) {
    ppBVar19 = &pBVar24->pPrev;
    pBVar21 = (Btree *)0x0;
    pBVar28 = p;
  }
  else {
    do {
      pBVar27 = pBVar24;
      pBVar28 = pBVar27->pNext;
      if (pBVar28 == (Btree *)0x0) {
        ppBVar19 = &pBVar27->pNext;
        pBVar24 = (Btree *)0x0;
        pBVar21 = pBVar27;
        pBVar28 = p;
        goto LAB_0014881b;
      }
      pBVar24 = pBVar28;
    } while (pBVar28->pBt < p->pBt);
    ppBVar19 = &pBVar27->pNext;
    p->pNext = pBVar28;
    lVar23 = 0x28;
    pBVar21 = p;
    pBVar24 = pBVar27;
  }
LAB_0014881b:
  *(Btree **)((long)&p->db + lVar23) = pBVar24;
  pBVar28->pPrev = pBVar21;
  *ppBVar19 = p;
LAB_00148826:
  *ppBtree = p;
  uVar8 = 0;
  pvVar17 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar17 == (void *)0x0) {
    sqlite3BtreeSetCacheSize(p,-2000);
  }
  psVar3 = __s->pPager->fd;
  psVar2 = psVar3->pMethods;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    (*psVar2->xFileControl)(psVar3,0x1e,&__s->db);
  }
  goto LAB_001487ef;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          if( rc==SQLITE_OK_SYMLINK ){
            rc = SQLITE_OK;
          }else{
            sqlite3_free(zFullPathname);
            sqlite3_free(p);
            return rc;
          }
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );

    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;

    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3BtreeSetCacheSize(p, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}